

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deflate_quick_bi_valid.cc
# Opt level: O0

void __thiscall deflate_quick_bi_valid_Test::TestBody(deflate_quick_bi_valid_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  uchar next_out [1236];
  uchar next_in [554];
  AssertionResult gtest_ar;
  int err;
  zng_stream strm;
  zng_stream *in_stack_fffffffffffff758;
  AssertHelper *in_stack_fffffffffffff760;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff768;
  undefined1 in_stack_fffffffffffff76f;
  char *in_stack_fffffffffffff770;
  char *in_stack_fffffffffffff778;
  int iVar3;
  AssertionResult *this_01;
  int32_t in_stack_fffffffffffff780;
  int32_t in_stack_fffffffffffff784;
  undefined4 uVar4;
  zng_stream *in_stack_fffffffffffff788;
  Type type;
  AssertHelper *in_stack_fffffffffffff790;
  AssertHelper *this_02;
  int32_t in_stack_fffffffffffff7a4;
  int32_t flush;
  zng_stream *in_stack_fffffffffffff7a8;
  Message *in_stack_fffffffffffff7d8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffff7e0;
  AssertionResult local_800 [2];
  undefined4 local_7dc;
  AssertionResult local_7d8;
  undefined1 local_7c8 [1248];
  AssertHelper local_2e8 [74];
  undefined4 local_94;
  AssertionResult local_90;
  int32_t local_7c;
  AssertHelper *local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  puStack_60 = (undefined1 *)0x0;
  local_78 = (AssertHelper *)0x0;
  uStack_70 = 0;
  local_18 = 0;
  local_7c = zng_deflateInit2(in_stack_fffffffffffff788,in_stack_fffffffffffff784,
                              in_stack_fffffffffffff780,
                              (int32_t)((ulong)in_stack_fffffffffffff778 >> 0x20),
                              (int32_t)in_stack_fffffffffffff778,
                              (int32_t)((ulong)in_stack_fffffffffffff770 >> 0x20));
  type = (Type)((ulong)in_stack_fffffffffffff788 >> 0x20);
  local_94 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             (int *)CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
             (int *)in_stack_fffffffffffff760);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff790);
    in_stack_fffffffffffff7a8 =
         (zng_stream *)testing::AssertionResult::failure_message((AssertionResult *)0x132407);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff790,type,
               (char *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (int)((ulong)in_stack_fffffffffffff778 >> 0x20),in_stack_fffffffffffff770);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff7e0._M_head_impl,in_stack_fffffffffffff7d8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff760);
    testing::Message::~Message((Message *)0x132464);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1324bc);
  this_02 = local_2e8;
  memcpy(this_02,&DAT_001ec830,0x22a);
  puStack_60 = local_7c8;
  uStack_70 = CONCAT44(uStack_70._4_4_,0x22a);
  local_58 = CONCAT44(local_58._4_4_,0x1f);
  local_78 = this_02;
  local_7c = zng_deflate(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4);
  local_7dc = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffff778,in_stack_fffffffffffff770,
             (int *)CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
             (int *)in_stack_fffffffffffff760);
  iVar3 = (int)((ulong)in_stack_fffffffffffff778 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7d8);
  flush = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7a4);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1325c7);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               iVar3,in_stack_fffffffffffff770);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff7e0._M_head_impl,in_stack_fffffffffffff7d8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff760);
    testing::Message::~Message((Message *)0x132624);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13267c);
  uStack_70 = uStack_70 & 0xffffffff00000000;
  local_58 = CONCAT44(local_58._4_4_,0x1f2);
  local_7c = zng_deflate(in_stack_fffffffffffff7a8,flush);
  this_01 = local_800;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_fffffffffffff770,
             (int *)CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),
             (int *)in_stack_fffffffffffff760);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff784);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_fffffffffffff770 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13274c);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)CONCAT44(uVar4,in_stack_fffffffffffff780),
               (int)((ulong)this_01 >> 0x20),in_stack_fffffffffffff770);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff7e0._M_head_impl,in_stack_fffffffffffff7d8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff760);
    testing::Message::~Message((Message *)0x1327a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1327fe);
  local_7c = zng_deflateEnd(in_stack_fffffffffffff758);
  this_00 = (AssertionResult *)&stack0xfffffffffffff7d8;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_fffffffffffff770,
             (int *)CONCAT17(in_stack_fffffffffffff76f,in_stack_fffffffffffff768),(int *)this_00);
  iVar3 = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0x1328aa);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)CONCAT44(uVar4,in_stack_fffffffffffff780),iVar3,
               in_stack_fffffffffffff770);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff7e0._M_head_impl,in_stack_fffffffffffff7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x1328f6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x132945);
  return;
}

Assistant:

TEST(deflate_quick, bi_valid) {
    PREFIX3(stream) strm;
    int err;

    memset(&strm, 0, sizeof(strm));

    err = PREFIX(deflateInit2)(&strm, 1, Z_DEFLATED, 31, 1, Z_FILTERED);
    EXPECT_EQ(err, Z_OK);

    z_const unsigned char next_in[554] = {
        0x8d, 0xff, 0xff, 0xff, 0xa2, 0x00, 0x00, 0xff, 0x00, 0x15, 0x1b, 0x1b, 0xa2, 0xa2, 0xaf, 0xa2,
        0xa2, 0x00, 0x00, 0x00, 0x02, 0x00, 0x1b, 0x3f, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x00, 0x0b,
        0x00, 0xab, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x01, 0x2b, 0x01, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x01, 0x1e, 0x00, 0x00, 0x01, 0x40, 0x00, 0x00, 0x00, 0x07, 0x01, 0x18, 0x00, 0x22, 0x00,
        0x00, 0x00, 0xfd, 0x39, 0xff, 0x00, 0x00, 0x00, 0x1b, 0xfd, 0x3b, 0x00, 0x68, 0x00, 0x00, 0x01,
        0xff, 0xff, 0xff, 0x57, 0xf8, 0x1e, 0x00, 0x00, 0xf2, 0xf2, 0xf2, 0xf2, 0xfa, 0xff, 0xff, 0xff,
        0xff, 0x7e, 0x00, 0x00, 0x4a, 0x00, 0xc5, 0x00, 0x41, 0x00, 0x00, 0x00, 0x01, 0x01, 0x00, 0x00,
        0x00, 0x02, 0x01, 0x01, 0x00, 0xa2, 0x08, 0x00, 0x00, 0x00, 0x00, 0x27, 0x4a, 0x4a, 0x4a, 0x32,
        0x00, 0xf9, 0xff, 0x00, 0x02, 0x9a, 0xff, 0x00, 0x00, 0x3f, 0x50, 0x00, 0x03, 0x00, 0x00, 0x00,
        0x3d, 0x00, 0x08, 0x2f, 0x20, 0x00, 0x23, 0x00, 0x00, 0x00, 0x00, 0x23, 0x00, 0xff, 0xff, 0xff,
        0xff, 0xff, 0xff, 0xff, 0x7a, 0x7a, 0x9e, 0xff, 0xff, 0x00, 0x1b, 0x1b, 0x04, 0x00, 0x1b, 0x1b,
        0x1b, 0x1b, 0x00, 0x00, 0x00, 0xaf, 0xad, 0xaf, 0x00, 0x00, 0xa8, 0x00, 0x00, 0x00, 0x2e, 0xff,
        0xff, 0x2e, 0xc1, 0x00, 0x10, 0x00, 0x00, 0x00, 0x06, 0x70, 0x00, 0x00, 0x00, 0xda, 0x67, 0x01,
        0x47, 0x00, 0x00, 0x00, 0x0c, 0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0xff, 0x00, 0x01, 0x00, 0x3f,
        0x54, 0x00, 0x00, 0x00, 0x1b, 0x00, 0x00, 0x00, 0x5c, 0x00, 0x00, 0x34, 0x3e, 0xc5, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x04, 0x00, 0x00, 0x7a, 0x00, 0x00, 0x00, 0x0a, 0x01, 0x00, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x7a, 0x7a, 0x7a, 0x7a, 0x7a, 0x00, 0x00, 0x00, 0x40, 0x1b, 0x1b, 0x88, 0x1b, 0x1b,
        0x1b, 0x1b, 0x1b, 0x1b, 0x1b, 0x1f, 0x1b, 0x00, 0x00, 0x00, 0x00, 0x00, 0x0b, 0x00, 0x00, 0x00,
        0x00, 0x04, 0x00, 0x00, 0x50, 0x3e, 0x7a, 0x7a, 0x00, 0x00, 0x40, 0x00, 0x40, 0x00, 0x00, 0x00,
        0x00, 0x00, 0x00, 0x08, 0x87, 0x00, 0x00, 0xff, 0xff, 0xff, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x01, 0x00, 0xff, 0x3d, 0x00, 0x11, 0x4d, 0x00, 0x00, 0x01, 0xd4, 0xd4, 0xd4, 0xd4, 0x2d, 0xd4,
        0xd4, 0xff, 0xff, 0xff, 0xfa, 0x01, 0xd4, 0x00, 0xd4, 0x00, 0x00, 0xd4, 0xd4, 0xd4, 0xd4, 0xd4,
        0xd4, 0x1e, 0x1e, 0x1e, 0x1e, 0x00, 0x00, 0xfe, 0xf9, 0x1e, 0x1e, 0x1e, 0x1e, 0x1e, 0x1e, 0x00,
        0x16, 0xd4, 0xd4, 0xd4, 0xd4, 0xd4, 0xd4, 0xd4, 0xd4, 0xd4, 0x00, 0x00, 0x80, 0x20, 0x00, 0x00,
        0xff, 0x2b, 0x2b, 0x2b, 0x2b, 0x35, 0xd4, 0xd4, 0x47, 0x3f, 0xd4, 0xd4, 0xd6, 0xd4, 0xd4, 0x00,
        0x00, 0x00, 0x00, 0x00, 0x32, 0x4a, 0x4a, 0x4a, 0x4a, 0x71, 0x00, 0x1b, 0x1b, 0x1b, 0x1b, 0x1b,
        0x1f, 0x1b, 0x1b, 0x1b, 0x57, 0x57, 0x57, 0x57, 0x00, 0x00, 0x1b, 0x08, 0x2b, 0x16, 0xc3, 0x00,
        0x00, 0x00, 0x29, 0x30, 0x03, 0xff, 0x03, 0x03, 0x03, 0x03, 0x07, 0x00, 0x00, 0x01, 0x0b, 0xff,
        0xff, 0xf5, 0xf5, 0xf5, 0x00, 0x00, 0xfe, 0xfa, 0x0f, 0x0f, 0x08, 0x00, 0xff, 0x00, 0x53, 0x3f,
        0x00, 0x04, 0x5d, 0xa8, 0x2e, 0xff, 0xff, 0x00, 0x2f, 0x2f, 0x05, 0xff, 0xff, 0xff, 0x2f, 0x2f,
        0x2f, 0x0a, 0x0a, 0x0a, 0x0a, 0x30, 0xff, 0xff, 0xff, 0xf0, 0x0a, 0x0a, 0x0a, 0x00, 0xff, 0x3f,
        0x4f, 0x00, 0x00, 0x00, 0x00, 0x08, 0x00, 0x00, 0x71, 0x00, 0x2e, 0x00, 0x00, 0x00, 0x00, 0x00,
        0x71, 0x71, 0x00, 0x71, 0x71, 0x71, 0xf5, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xf8, 0xff,
        0xff, 0xff, 0x00, 0x00, 0x00, 0x00, 0x00, 0xdb, 0x3f, 0x00, 0xfa, 0x71, 0x71, 0x71, 0x00, 0x00,
        0x00, 0x01, 0x00, 0x00, 0x00, 0x71, 0x71, 0x71, 0x71, 0x71};
    strm.next_in = next_in;
    unsigned char next_out[1236];
    strm.next_out = next_out;

    strm.avail_in = 554;
    strm.avail_out = 31;

    err = PREFIX(deflate)(&strm, Z_FINISH);
    EXPECT_EQ(err, Z_OK);

    strm.avail_in = 0;
    strm.avail_out = 498;
    err = PREFIX(deflate)(&strm, Z_FINISH);
    EXPECT_EQ(err, Z_STREAM_END);

    err = PREFIX(deflateEnd)(&strm);
    EXPECT_EQ(err, Z_OK);
}